

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransService.cpp
# Opt level: O3

XMLTranscoder * __thiscall
xercesc_4_0::XMLTransService::makeNewTranscoderFor
          (XMLTransService *this,Encodings encodingEnum,Codes *resValue,XMLSize_t blockSize,
          MemoryManager *manager)

{
  int iVar1;
  XMLTranscoder *pXVar2;
  ENameMap *pEVar3;
  undefined4 extraout_var;
  XMLCh *pXVar4;
  undefined4 extraout_var_00;
  Codes CVar5;
  
  if (encodingEnum < Encodings_Count) {
    pEVar3 = BaseRefVectorOf<xercesc_4_0::ENameMap>::elementAt
                       (gMappingsRecognizer,(ulong)encodingEnum);
    if (pEVar3 == (ENameMap *)0x0) {
      pXVar4 = XMLRecognizer::nameForEncoding(encodingEnum,manager);
      iVar1 = (*this->_vptr_XMLTransService[9])(this,pXVar4,resValue,blockSize,manager);
      pXVar2 = (XMLTranscoder *)CONCAT44(extraout_var_00,iVar1);
      CVar5 = Ok;
      if (pXVar2 == (XMLTranscoder *)0x0) {
        return (XMLTranscoder *)0x0;
      }
    }
    else {
      iVar1 = (*pEVar3->_vptr_ENameMap[2])(pEVar3,blockSize,manager);
      pXVar2 = (XMLTranscoder *)CONCAT44(extraout_var,iVar1);
      CVar5 = (uint)(pXVar2 == (XMLTranscoder *)0x0) * 2;
    }
  }
  else {
    CVar5 = InternalFailure;
    pXVar2 = (XMLTranscoder *)0x0;
  }
  *resValue = CVar5;
  return pXVar2;
}

Assistant:

XMLTranscoder*
XMLTransService::makeNewTranscoderFor(  XMLRecognizer::Encodings        encodingEnum
                                        ,       XMLTransService::Codes& resValue
                                        , const XMLSize_t               blockSize
                                        ,       MemoryManager* const    manager)
{
    //
    // We can only make transcoder if the passed encodingEnum is under this range
    //
    if (encodingEnum < XMLRecognizer::Encodings_Min || encodingEnum > XMLRecognizer::Encodings_Max) {
        resValue = XMLTransService::InternalFailure;
        return 0;
    }

    ENameMap* ourMapping = gMappingsRecognizer->elementAt(encodingEnum);

    // If we found it, then call the factory method for it
    if (ourMapping)    {
       XMLTranscoder* temp = ourMapping->makeNew(blockSize, manager);
       resValue = temp ? XMLTransService::Ok : XMLTransService::InternalFailure;
       return temp;
    }
    else {
        XMLTranscoder* temp =  makeNewXMLTranscoder(XMLRecognizer::nameForEncoding(encodingEnum, manager), resValue, blockSize, manager);

        // if successful, set resValue to OK
        // if failed, the makeNewXMLTranscoder has already set the proper failing resValue
        if (temp) resValue =  XMLTransService::Ok;

        return temp;
    }

}